

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

void * DummyReadRemoteMemory
                 (CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t Timestep,size_t Offset,
                 size_t Length,void *Buffer,void *DP_TimestepInfo)

{
  undefined4 uVar1;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  _DummyReadRequestMsg ReadRequestMsg;
  DummyCompletionHandle ret;
  CManager cm;
  Dummy_RS_Stream Stream;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  undefined8 *local_8;
  
  local_38 = in_RSI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_40 = (*(code *)in_RDI[1])(*(undefined8 *)(in_RSI + 8));
  local_48 = (undefined4 *)malloc(0x28);
  uVar1 = CMCondition_get(local_40,0);
  *local_48 = uVar1;
  *(undefined8 *)(local_48 + 4) = *(undefined8 *)(local_38 + 8);
  *(undefined8 *)(local_48 + 2) = local_40;
  *(size_t *)(local_48 + 6) = ReadRequestMsg.Offset;
  local_48[8] = local_14;
  CMCondition_set_client_data(local_40,*local_48,local_48);
  (*(code *)*local_8)(*(undefined8 *)(local_38 + 8),5,
                      "Adios requesting to read remote memory for Timestep %d from Rank %d, WSR_Stream = %p\n"
                      ,local_20,local_14,
                      *(undefined8 *)(*(long *)(local_38 + 0x28) + (long)local_14 * 0x10 + 8));
  memset(&local_78,0,0x30);
  local_78 = local_20;
  local_70 = local_28;
  local_68 = local_30;
  local_60 = *(undefined8 *)(*(long *)(local_38 + 0x28) + (long)local_14 * 0x10 + 8);
  local_58 = local_38;
  local_50 = *(undefined4 *)(local_38 + 0x18);
  local_4c = *local_48;
  (*(code *)local_8[2])
            (*(undefined8 *)(local_38 + 8),*(undefined8 *)(local_38 + 0x20),local_14,
             *(undefined8 *)(local_38 + 0x10),&local_78);
  return local_48;
}

Assistant:

static void *DummyReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank,
                                   size_t Timestep, size_t Offset, size_t Length, void *Buffer,
                                   void *DP_TimestepInfo)
{
    Dummy_RS_Stream Stream =
        (Dummy_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    DummyCompletionHandle ret = malloc(sizeof(struct _DummyCompletionHandle));
    struct _DummyReadRequestMsg ReadRequestMsg;

    ret->CMcondition = CMCondition_get(cm, NULL);
    ret->CPStream = Stream->CP_Stream;
    ret->cm = cm;
    ret->Buffer = Buffer;
    ret->Rank = Rank;
    /*
     * set the completion handle as client Data on the condition so that
     * handler has access to it.
     */
    CMCondition_set_client_data(cm, ret->CMcondition, ret);

    Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                  "Adios requesting to read remote memory for Timestep %d "
                  "from Rank %d, WSR_Stream = %p\n",
                  Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream);

    /* send request to appropriate writer */
    /* memset avoids uninit byte warnings from valgrind */
    memset(&ReadRequestMsg, 0, sizeof(ReadRequestMsg));
    ReadRequestMsg.Timestep = Timestep;
    ReadRequestMsg.Offset = Offset;
    ReadRequestMsg.Length = Length;
    ReadRequestMsg.WS_Stream = Stream->WriterContactInfo[Rank].WS_Stream;
    ReadRequestMsg.RS_Stream = Stream;
    ReadRequestMsg.RequestingRank = Stream->Rank;
    ReadRequestMsg.NotifyCondition = ret->CMcondition;
    Svcs->sendToPeer(Stream->CP_Stream, Stream->PeerCohort, Rank, Stream->ReadRequestFormat,
                     &ReadRequestMsg);

    return ret;
}